

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::TextureSpecCase::renderTex
          (TextureSpecCase *this,Surface *dst,deUint32 program,int width,int height)

{
  ContextWrapper *this_00;
  int iVar1;
  int iVar2;
  Context *ctx;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vec3 local_50;
  Vec3 local_40;
  
  this_00 = &this->super_ContextWrapper;
  iVar1 = sglr::ContextWrapper::getWidth(this_00);
  iVar2 = sglr::ContextWrapper::getHeight(this_00);
  auVar4._4_4_ = (float)height;
  auVar4._0_4_ = (float)width;
  ctx = sglr::ContextWrapper::getCurrentContext(this_00);
  local_40.m_data[0] = -1.0;
  local_40.m_data[1] = -1.0;
  local_40.m_data[2] = 0.0;
  auVar3._0_4_ = (float)iVar1;
  auVar3._4_4_ = (float)iVar2;
  auVar3._8_8_ = 0;
  auVar4._8_8_ = 0;
  auVar4 = divps(auVar4,auVar3);
  local_50.m_data[0] = auVar4._0_4_ + auVar4._0_4_ + -1.0;
  local_50.m_data[1] = auVar4._4_4_ + auVar4._4_4_ + -1.0;
  local_50.m_data[2] = 0.0;
  sglr::drawQuad(ctx,program,&local_40,&local_50);
  readPixels(this,dst,0,0,width,height);
  return;
}

Assistant:

void TextureSpecCase::renderTex (tcu::Surface& dst, deUint32 program, int width, int height)
{
	int		targetW		= getWidth();
	int		targetH		= getHeight();

	float	w			= (float)width	/ (float)targetW;
	float	h			= (float)height	/ (float)targetH;

	sglr::drawQuad(*getCurrentContext(), program, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(-1.0f + w*2.0f, -1.0f + h*2.0f, 0.0f));

	// Read pixels back.
	readPixels(dst, 0, 0, width, height);
}